

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O1

QDataStream *
QtPrivate::readArrayBasedContainer<QList<QList<QString>>>(QDataStream *s,QList<QList<QString>_> *c)

{
  QDataStream QVar1;
  QDataStream QVar2;
  char cVar3;
  Data *asize;
  long in_FS_OFFSET;
  qint64 extendedLen;
  quint32 first;
  QArrayDataPointer<QString> local_58;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = s[0x13];
  cVar3 = QDataStream::isDeviceTransactionStarted();
  if (cVar3 == '\0') {
    QDataStream::resetStatus();
  }
  QList<QList<QString>_>::clear(c);
  local_3c = 0xaaaaaaaa;
  QDataStream::operator>>(s,(int *)&local_3c);
  asize = (Data *)(ulong)local_3c;
  if (asize == (Data *)0xffffffff) {
    asize = (Data *)0xffffffffffffffff;
  }
  else if ((local_3c == 0xfffffffe) && (0x15 < *(int *)(s + 0x18))) {
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(s,(longlong *)&local_58);
    asize = local_58.d;
  }
  if ((long)asize < 0) {
    QDataStream::setStatus((Status)s);
  }
  else {
    QList<QList<QString>_>::reserve(c,(qsizetype)asize);
    do {
      if (asize == (Data *)0x0) break;
      asize = (Data *)((long)&asize[-1].super_QArrayData.alloc + 7);
      local_58.d = (Data *)0x0;
      local_58.ptr = (QString *)0x0;
      local_58.size = 0;
      readArrayBasedContainer<QList<QString>>(s,(QList<QString> *)&local_58);
      QVar2 = s[0x13];
      if (QVar2 == (QDataStream)0x0) {
        QMovableArrayOps<QList<QString>>::emplace<QList<QString>const&>
                  ((QMovableArrayOps<QList<QString>> *)c,(c->d).size,(QList<QString> *)&local_58);
        QList<QList<QString>_>::end(c);
      }
      else {
        QList<QList<QString>_>::clear(c);
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    } while (QVar2 == (QDataStream)0x0);
  }
  if (QVar1 != (QDataStream)0x0) {
    QDataStream::resetStatus();
    QDataStream::setStatus((Status)s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}